

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_denoise_and_model_run
              (aom_denoise_and_model_t *ctx,YV12_BUFFER_CONFIG *sd,aom_film_grain_t *film_grain,
              int apply_denoise)

{
  uint8_t **denoised;
  aom_noise_model_t *noise_model;
  uint8_t *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  byte bVar5;
  aom_noise_status_t aVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint8_t *puVar10;
  sbyte sVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint use_highbd;
  ulong uVar15;
  float fVar16;
  float fVar17;
  aom_noise_model_params_t params;
  int strides [3];
  undefined8 local_70;
  ulong local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *data [3];
  
  iVar9 = ctx->block_size;
  uVar14 = sd->flags;
  uVar13 = uVar14 & 8;
  puVar10 = (sd->field_5).field_0.y_buffer;
  puVar1 = (sd->field_5).field_0.u_buffer;
  local_58 = (sd->field_5).field_0.v_buffer;
  local_60 = (uint8_t *)((long)puVar1 * 2);
  local_50 = (uint8_t *)((long)puVar10 * 2);
  if (uVar13 == 0) {
    local_60 = puVar1;
    local_50 = puVar10;
  }
  if (uVar13 != 0) {
    local_58 = (uint8_t *)((long)local_58 * 2);
  }
  strides[0] = (sd->field_4).field_0.y_stride;
  strides[1] = (sd->field_4).field_0.uv_stride;
  local_70._0_4_ = sd->subsampling_x;
  local_70._4_4_ = sd->subsampling_y;
  iVar8 = (sd->field_0).field_0.y_width;
  strides[2] = strides[1];
  data[0] = local_50;
  data[1] = local_60;
  data[2] = local_58;
  if ((((ctx->width != iVar8) || (ctx->height != (sd->field_1).field_0.y_height)) ||
      (ctx->y_stride != strides[0])) || (ctx->uv_stride != strides[1])) {
    ctx->width = iVar8;
    ctx->height = (sd->field_1).field_0.y_height;
    ctx->y_stride = (sd->field_4).field_0.y_stride;
    ctx->uv_stride = (sd->field_4).field_0.uv_stride;
    lVar12 = 8;
    do {
      aom_free(ctx->noise_psd[lVar12 + -5]);
      ctx->noise_psd[lVar12 + -5] = (float *)0x0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xb);
    uVar14 = uVar14 >> 3;
    use_highbd = uVar14 & 1;
    aom_free(ctx->flat_blocks);
    ctx->flat_blocks = (uint8_t *)0x0;
    sVar11 = (sbyte)use_highbd;
    puVar10 = (uint8_t *)
              aom_malloc((long)((sd->field_1).field_0.y_height * (sd->field_4).field_0.y_stride <<
                               sVar11));
    ctx->denoised[0] = puVar10;
    puVar10 = (uint8_t *)
              aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                               sVar11));
    ctx->denoised[1] = puVar10;
    puVar10 = (uint8_t *)
              aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                               sVar11));
    ctx->denoised[2] = puVar10;
    if (((ctx->denoised[0] == (uint8_t *)0x0) || (ctx->denoised[1] == (uint8_t *)0x0)) ||
       (puVar10 == (uint8_t *)0x0)) {
      aom_denoise_and_model_run_cold_4();
LAB_002a8ab5:
      aom_denoise_and_model_run_cold_5();
      return 0;
    }
    iVar8 = ctx->block_size;
    iVar7 = ((sd->field_0).field_0.y_width + iVar8 + -1) / iVar8;
    ctx->num_blocks_w = iVar7;
    iVar8 = (iVar8 + -1 + (sd->field_1).field_0.y_height) / iVar8;
    ctx->num_blocks_h = iVar8;
    puVar10 = (uint8_t *)aom_malloc((long)(iVar8 * iVar7));
    ctx->flat_blocks = puVar10;
    if (puVar10 == (uint8_t *)0x0) {
      aom_denoise_and_model_run_cold_3();
      goto LAB_002a8ab5;
    }
    aom_free((ctx->flat_block_finder).A);
    aom_free((ctx->flat_block_finder).AtA_inv);
    (ctx->flat_block_finder).num_params = 0;
    (ctx->flat_block_finder).block_size = 0;
    (ctx->flat_block_finder).normalization = 0.0;
    (ctx->flat_block_finder).AtA_inv = (double *)0x0;
    (ctx->flat_block_finder).A = (double *)0x0;
    *(undefined8 *)&(ctx->flat_block_finder).use_highbd = 0;
    iVar8 = aom_flat_block_finder_init
                      (&ctx->flat_block_finder,ctx->block_size,ctx->bit_depth,use_highbd);
    if (iVar8 == 0) {
      aom_denoise_and_model_run_cold_2();
      goto LAB_002a8ab5;
    }
    uVar15 = CONCAT44(uVar14,ctx->bit_depth) & 0x1ffffffff;
    aom_noise_model_free(&ctx->noise_model);
    params.bit_depth = (int)uVar15;
    params.use_highbd = (int)(uVar15 >> 0x20);
    params.shape = '\x01';
    params._1_3_ = 0;
    params.lag = 3;
    iVar8 = aom_noise_model_init(&ctx->noise_model,params);
    if (iVar8 == 0) {
      aom_denoise_and_model_run_cold_1();
      goto LAB_002a8ab5;
    }
    fVar16 = aom_noise_psd_get_default_value(ctx->block_size,ctx->noise_level);
    fVar17 = aom_noise_psd_get_default_value
                       (ctx->block_size >> ((byte)sd->subsampling_x & 0x1f),ctx->noise_level);
    if (iVar9 != 0) {
      pfVar2 = ctx->noise_psd[0];
      pfVar3 = ctx->noise_psd[1];
      pfVar4 = ctx->noise_psd[2];
      uVar15 = 0;
      do {
        pfVar2[uVar15] = fVar16;
        pfVar4[uVar15] = fVar17;
        pfVar3[uVar15] = fVar17;
        uVar15 = uVar15 + 1;
      } while (iVar9 * iVar9 + (uint)(iVar9 * iVar9 == 0) != uVar15);
    }
  }
  iVar8 = strides[0];
  aom_flat_block_finder_run
            (&ctx->flat_block_finder,data[0],(sd->field_0).field_0.y_width,
             (sd->field_1).field_0.y_height,strides[0],ctx->flat_blocks);
  denoised = ctx->denoised;
  iVar7 = aom_wiener_denoise_2d
                    (data,denoised,(sd->field_0).field_0.y_width,(sd->field_1).field_0.y_height,
                     strides,(int *)&local_70,ctx->noise_psd,iVar9,ctx->bit_depth,uVar13 >> 3);
  if (iVar7 == 0) {
    aom_denoise_and_model_run_cold_7();
    return 0;
  }
  noise_model = &ctx->noise_model;
  local_68 = (ulong)(uVar13 >> 3);
  aVar6 = aom_noise_model_update
                    (noise_model,data,denoised,(sd->field_0).field_0.y_width,
                     (sd->field_1).field_0.y_height,strides,(int *)&local_70,ctx->flat_blocks,iVar9)
  ;
  if (aVar6 != '\0') {
    if (aVar6 != '\x03') {
      iVar9 = (ctx->noise_model).combined_state[0].strength_solver.num_equations;
      film_grain->apply_grain = 0;
      if (iVar9 < 1) {
        return 1;
      }
      goto LAB_002a89ea;
    }
    aom_noise_model_save_latest(noise_model);
  }
  film_grain->apply_grain = 0;
LAB_002a89ea:
  iVar9 = aom_noise_model_get_grain_parameters(noise_model,film_grain);
  if (iVar9 == 0) {
    aom_denoise_and_model_run_cold_6();
    return 0;
  }
  if (film_grain->random_seed == 0) {
    film_grain->random_seed = 0x1cdf;
  }
  if (apply_denoise != 0) {
    bVar5 = (byte)local_68;
    memcpy(local_50,*denoised,(long)(iVar8 * (sd->field_1).field_0.y_height << (bVar5 & 0x1f)));
    if (sd->monochrome == '\0') {
      memcpy(local_60,ctx->denoised[1],
             (long)((sd->field_1).field_0.uv_height * strides[1] << (bVar5 & 0x1f)));
      memcpy(local_58,ctx->denoised[2],
             (long)((sd->field_1).field_0.uv_height * strides[2] << (bVar5 & 0x1f)));
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int aom_denoise_and_model_run(struct aom_denoise_and_model_t *ctx,
                              const YV12_BUFFER_CONFIG *sd,
                              aom_film_grain_t *film_grain, int apply_denoise) {
  const int block_size = ctx->block_size;
  const int use_highbd = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;
  uint8_t *raw_data[3] = {
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->y_buffer) : sd->y_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->u_buffer) : sd->u_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->v_buffer) : sd->v_buffer,
  };
  const uint8_t *const data[3] = { raw_data[0], raw_data[1], raw_data[2] };
  int strides[3] = { sd->y_stride, sd->uv_stride, sd->uv_stride };
  int chroma_sub_log2[2] = { sd->subsampling_x, sd->subsampling_y };

  if (!denoise_and_model_realloc_if_necessary(ctx, sd)) {
    fprintf(stderr, "Unable to realloc buffers\n");
    return 0;
  }

  aom_flat_block_finder_run(&ctx->flat_block_finder, data[0], sd->y_width,
                            sd->y_height, strides[0], ctx->flat_blocks);

  if (!aom_wiener_denoise_2d(data, ctx->denoised, sd->y_width, sd->y_height,
                             strides, chroma_sub_log2, ctx->noise_psd,
                             block_size, ctx->bit_depth, use_highbd)) {
    fprintf(stderr, "Unable to denoise image\n");
    return 0;
  }

  const aom_noise_status_t status = aom_noise_model_update(
      &ctx->noise_model, data, (const uint8_t *const *)ctx->denoised,
      sd->y_width, sd->y_height, strides, chroma_sub_log2, ctx->flat_blocks,
      block_size);
  int have_noise_estimate = 0;
  if (status == AOM_NOISE_STATUS_OK) {
    have_noise_estimate = 1;
  } else if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
    aom_noise_model_save_latest(&ctx->noise_model);
    have_noise_estimate = 1;
  } else {
    // Unable to update noise model; proceed if we have a previous estimate.
    have_noise_estimate =
        (ctx->noise_model.combined_state[0].strength_solver.num_equations > 0);
  }

  film_grain->apply_grain = 0;
  if (have_noise_estimate) {
    if (!aom_noise_model_get_grain_parameters(&ctx->noise_model, film_grain)) {
      fprintf(stderr, "Unable to get grain parameters.\n");
      return 0;
    }
    if (!film_grain->random_seed) {
      film_grain->random_seed = 7391;
    }
    if (apply_denoise) {
      memcpy(raw_data[0], ctx->denoised[0],
             (strides[0] * sd->y_height) << use_highbd);
      if (!sd->monochrome) {
        memcpy(raw_data[1], ctx->denoised[1],
               (strides[1] * sd->uv_height) << use_highbd);
        memcpy(raw_data[2], ctx->denoised[2],
               (strides[2] * sd->uv_height) << use_highbd);
      }
    }
  }
  return 1;
}